

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void ImFontAtlasBuildPackCustomRects(ImFontAtlas *atlas,void *stbrp_context_opaque)

{
  ushort uVar1;
  uint num_rects;
  uint uVar2;
  ImFontAtlasCustomRect *pIVar3;
  stbrp_rect *rects;
  long lVar4;
  char *__function;
  int iVar5;
  long lVar6;
  ulong uVar7;
  ImVector<stbrp_rect> pack_rects;
  
  if (stbrp_context_opaque == (void *)0x0) {
    __assert_fail("pack_context != __null",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/imgui/imgui_draw.cpp"
                  ,0x848,"void ImFontAtlasBuildPackCustomRects(ImFontAtlas *, void *)");
  }
  num_rects = (atlas->CustomRects).Size;
  if ((int)num_rects < 1) {
    __assert_fail("user_rects.Size >= 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/imgui/imgui_draw.cpp"
                  ,0x84b,"void ImFontAtlasBuildPackCustomRects(ImFontAtlas *, void *)");
  }
  uVar7 = 8;
  if (8 < num_rects) {
    uVar7 = (ulong)num_rects;
  }
  rects = (stbrp_rect *)ImGui::MemAlloc(uVar7 << 4);
  memset(rects,0,(ulong)(num_rects << 4));
  lVar4 = (long)(atlas->CustomRects).Size;
  if (0 < lVar4) {
    pIVar3 = (atlas->CustomRects).Data;
    lVar6 = 0;
    do {
      if ((ulong)num_rects << 4 == lVar6) {
        __function = "T &ImVector<stbrp_rect>::operator[](int) [T = stbrp_rect]";
        goto LAB_00159b58;
      }
      *(undefined4 *)((long)&rects->w + lVar6) = *(undefined4 *)(&pIVar3->Width + lVar6);
      lVar6 = lVar6 + 0x10;
    } while (lVar4 * 0x10 != lVar6);
  }
  stbrp_pack_rects((stbrp_context *)stbrp_context_opaque,rects,num_rects);
  lVar4 = 4;
  uVar7 = 0;
  do {
    if (*(int *)((long)&rects->x + lVar4) != 0) {
      if ((long)(atlas->CustomRects).Size <= (long)uVar7) {
        __function = 
        "T &ImVector<ImFontAtlasCustomRect>::operator[](int) [T = ImFontAtlasCustomRect]";
LAB_00159b58:
        __assert_fail("i < Size",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/imgui/imgui.h"
                      ,0x4d8,__function);
      }
      pIVar3 = (atlas->CustomRects).Data;
      uVar2 = *(uint *)((long)&rects->w + lVar4);
      *(uint *)((long)&pIVar3->ID + lVar4 * 2) = uVar2;
      if ((*(short *)((long)&rects->id + lVar4) != *(short *)((long)pIVar3 + lVar4 * 2 + -4)) ||
         (uVar1 = *(ushort *)((long)&rects->id + lVar4 + 2),
         uVar1 != *(ushort *)((long)pIVar3 + lVar4 * 2 + -2))) {
        __assert_fail("pack_rects[i].w == user_rects[i].Width && pack_rects[i].h == user_rects[i].Height"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/imgui/imgui_draw.cpp"
                      ,0x85b,"void ImFontAtlasBuildPackCustomRects(ImFontAtlas *, void *)");
      }
      iVar5 = (uint)uVar1 + (uVar2 >> 0x10);
      if (iVar5 < atlas->TexHeight) {
        iVar5 = atlas->TexHeight;
      }
      atlas->TexHeight = iVar5;
    }
    uVar7 = uVar7 + 1;
    lVar4 = lVar4 + 0x10;
    if (num_rects == uVar7) {
      ImGui::MemFree(rects);
      return;
    }
  } while( true );
}

Assistant:

void ImFontAtlasBuildPackCustomRects(ImFontAtlas* atlas, void* stbrp_context_opaque)
{
    stbrp_context* pack_context = (stbrp_context*)stbrp_context_opaque;
    IM_ASSERT(pack_context != NULL);

    ImVector<ImFontAtlasCustomRect>& user_rects = atlas->CustomRects;
    IM_ASSERT(user_rects.Size >= 1); // We expect at least the default custom rects to be registered, else something went wrong.

    ImVector<stbrp_rect> pack_rects;
    pack_rects.resize(user_rects.Size);
    memset(pack_rects.Data, 0, (size_t)pack_rects.size_in_bytes());
    for (int i = 0; i < user_rects.Size; i++)
    {
        pack_rects[i].w = user_rects[i].Width;
        pack_rects[i].h = user_rects[i].Height;
    }
    stbrp_pack_rects(pack_context, &pack_rects[0], pack_rects.Size);
    for (int i = 0; i < pack_rects.Size; i++)
        if (pack_rects[i].was_packed)
        {
            user_rects[i].X = pack_rects[i].x;
            user_rects[i].Y = pack_rects[i].y;
            IM_ASSERT(pack_rects[i].w == user_rects[i].Width && pack_rects[i].h == user_rects[i].Height);
            atlas->TexHeight = ImMax(atlas->TexHeight, pack_rects[i].y + pack_rects[i].h);
        }
}